

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_parser.h
# Opt level: O1

Status sentencepiece::SentencePieceTrainer::SetProtoField
                 (string_view name,string_view value,TrainerSpec *message)

{
  char *pcVar1;
  uint32 *puVar2;
  _Rb_tree_color _Var3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  string_util *this;
  string_util *psVar7;
  double *result;
  double *result_00;
  double *pdVar8;
  char *__s1;
  void *pvVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  char *__n;
  TrainerSpec *pTVar12;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  this_00;
  TrainerSpec *in_R9;
  size_type __rlen;
  string *val;
  undefined1 auVar13 [8];
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  string_view arg_07;
  string_view arg_08;
  string_view arg_09;
  string_view arg_10;
  string_view arg_11;
  string_view arg_12;
  string_view arg_13;
  string_view arg_14;
  string_view arg_15;
  string_view arg_16;
  string_view arg_17;
  string_view arg_18;
  string_view arg_19;
  string_view arg_20;
  string_view arg_21;
  string_view arg_22;
  string_view arg_23;
  string_view arg_24;
  string_view arg_25;
  string_view arg_26;
  string_view arg_27;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>
  __l;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  int32 v;
  string upper_value;
  int32 local_1c8;
  undefined4 uStack_1c4;
  allocator_type local_1b9;
  undefined1 local_1b8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
  local_140 [6];
  long local_38;
  
  this = (string_util *)value._M_str;
  __s1 = (char *)value._M_len;
  __n = name._M_str;
  this_00._M_t.
  super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  ._M_t.
  super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
  .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl =
       (__uniq_ptr_data<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>,_true,_true>
        )name._M_len;
  if (in_R9 == (TrainerSpec *)0x0) {
    local_1b8._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"third_party/sentencepiece/src/spec_parser.h",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"(",1);
    std::ostream::operator<<((ostringstream *)&local_1b0,0xc5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"message",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"] ",2);
    util::StatusBuilder::operator_cast_to_Status
              ((StatusBuilder *)
               this_00._M_t.
               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
    goto LAB_0020da34;
  }
  if (__n == (char *)0xc) {
    iVar5 = bcmp(__s1,"input_format",0xc);
    if (iVar5 == 0) {
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      *(byte *)(in_R9->_has_bits_).has_bits_ = (byte)(in_R9->_has_bits_).has_bits_[0] | 2;
      pvVar9 = (in_R9->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar9 & 1) != 0) {
        pvVar9 = *(void **)((ulong)pvVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set(&in_R9->input_format_,local_1b8,pvVar9);
    }
    else {
      iVar5 = bcmp(__s1,"model_prefix",0xc);
      if (iVar5 != 0) goto LAB_0020c59c;
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,message,this + (long)message);
      *(byte *)(in_R9->_has_bits_).has_bits_ = (byte)(in_R9->_has_bits_).has_bits_[0] | 1;
      pvVar9 = (in_R9->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar9 & 1) != 0) {
        pvVar9 = *(void **)((ulong)pvVar9 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set(&in_R9->model_prefix_,local_1b8,pvVar9);
    }
    goto LAB_0020de4a;
  }
  if ((__n == (char *)0x5) && (psVar7 = this, iVar5 = bcmp(__s1,"input",5), iVar5 == 0)) {
    text._M_str = (char *)psVar7;
    text._M_len = (size_t)message;
    util::StrSplitAsCSV_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8,(util *)this,text);
    for (auVar13 = local_1b8; auVar13 != (undefined1  [8])local_1b0;
        auVar13 = (undefined1  [8])((long)auVar13 + 0x20)) {
      TrainerSpec::add_input(in_R9,(string *)auVar13);
    }
    goto LAB_0020de94;
  }
LAB_0020c59c:
  if ((SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
       ::kModelType_Map_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                                   ::kModelType_Map_abi_cxx11_), iVar5 != 0)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
    ::pair<const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
                *)local_1b8,(char (*) [8])0x347e0b,&TrainerSpec::UNIGRAM);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
    ::pair<const_char_(&)[4],_true>(&local_190,(char (*) [4])0x3481e2,&TrainerSpec::BPE);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
    ::pair<const_char_(&)[5],_true>(&local_168,(char (*) [5])"WORD",&TrainerSpec::WORD);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
    ::pair<const_char_(&)[5],_true>(local_140,(char (*) [5])"CHAR",&TrainerSpec::CHAR);
    __l._M_len = 4;
    __l._M_array = (iterator)local_1b8;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
    ::map(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
           ::kModelType_Map_abi_cxx11_,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_1c8,&local_1b9);
    local_38 = -0xa0;
    paVar10 = &local_140[0].first.field_2;
    do {
      if (paVar10 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar10->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar10->_M_allocated_capacity)[-2],
                        paVar10->_M_allocated_capacity + 1);
      }
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar10->_M_allocated_capacity + -5);
      local_38 = local_38 + 0x28;
    } while (local_38 != 0);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
                 ::~map,&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                         ::kModelType_Map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                         ::kModelType_Map_abi_cxx11_);
  }
  pcVar1 = __n + -6;
  if (pcVar1 < (char *)0x22) {
    result = (double *)
             ((long)&switchD_0020c5c6::switchdataD_00258c44 +
             (long)(int)(&switchD_0020c5c6::switchdataD_00258c44)[(long)pcVar1]);
    result_00 = result;
    pdVar8 = result;
    switch(pcVar1) {
    case (char *)0x0:
switchD_0020c5c6_caseD_0:
      iVar5 = bcmp(__s1,"unk_id",(size_t)__n);
      if (iVar5 == 0) {
        arg._M_str = (char *)&local_1c8;
        arg._M_len = (size_t)message;
        bVar4 = string_util::lexical_cast<int>(this,arg,(int *)result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x200000;
        in_R9->unk_id_ = local_1c8;
        goto LAB_0020de9e;
      }
      if (0x1a < (long)__n) goto LAB_0020d8ed;
      if (__n == (char *)0x6) {
        iVar5 = bcmp(__s1,"bos_id",6);
        if (iVar5 == 0) {
          arg_21._M_str = (char *)&local_1c8;
          arg_21._M_len = (size_t)message;
          bVar4 = string_util::lexical_cast<int>(this,arg_21,(int *)result);
          if (bVar4) {
            puVar2 = (in_R9->_has_bits_).has_bits_ + 1;
            *puVar2 = *puVar2 | 0x80;
            in_R9->bos_id_ = local_1c8;
            goto LAB_0020de9e;
          }
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        iVar5 = bcmp(__s1,"eos_id",6);
        if (iVar5 == 0) {
          arg_26._M_str = (char *)&local_1c8;
          arg_26._M_len = (size_t)message;
          bVar4 = string_util::lexical_cast<int>(this,arg_26,(int *)result);
          if (!bVar4) {
            local_1b8._0_4_ = 3;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0,"cannot parse \"",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0,(char *)message,(long)this);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9)
            ;
            util::StatusBuilder::operator_cast_to_Status
                      ((StatusBuilder *)
                       this_00._M_t.
                       super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                       _M_head_impl);
            goto LAB_0020da34;
          }
          puVar2 = (in_R9->_has_bits_).has_bits_ + 1;
          *puVar2 = *puVar2 | 0x100;
          in_R9->eos_id_ = local_1c8;
          goto LAB_0020de9e;
        }
        iVar5 = bcmp(__s1,"pad_id",6);
        if (iVar5 == 0) {
          arg_27._M_str = (char *)&local_1c8;
          arg_27._M_len = (size_t)message;
          bVar4 = string_util::lexical_cast<int>(this,arg_27,(int *)result);
          if (!bVar4) {
            local_1b8._0_4_ = 3;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0,"cannot parse \"",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0,(char *)message,(long)this);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9)
            ;
            util::StatusBuilder::operator_cast_to_Status
                      ((StatusBuilder *)
                       this_00._M_t.
                       super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                       _M_head_impl);
            goto LAB_0020da34;
          }
          puVar2 = (in_R9->_has_bits_).has_bits_ + 1;
          *puVar2 = *puVar2 | 0x200;
          in_R9->pad_id_ = local_1c8;
          goto LAB_0020de9e;
        }
      }
LAB_0020c5f6:
      if (__n == (char *)0x9) goto switchD_0020c5c6_caseD_3;
LAB_0020d93a:
      if (__n == (char *)0xb) {
switchD_0020d7e2_caseD_5:
        iVar5 = bcmp(__s1,"unk_surface",(size_t)__n);
        if (iVar5 == 0) {
          local_1b8 = (undefined1  [8])&local_1a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b8,message,this + (long)message);
          TrainerSpec::set_unk_surface(in_R9,(string *)local_1b8);
          goto LAB_0020de4a;
        }
        if (__n == (char *)0x27) goto switchD_0020c5c6_caseD_21;
        pdVar8 = result;
        if (__n == (char *)0x20) goto switchD_0020c5c6_caseD_1a;
LAB_0020d96a:
        pdVar8 = result;
        if (__n == (char *)0x1b) goto switchD_0020c5c6_caseD_15;
      }
      break;
    case (char *)0x3:
switchD_0020c5c6_caseD_3:
      iVar5 = bcmp(__s1,"unk_piece",(size_t)__n);
      if (iVar5 == 0) {
        local_1b8 = (undefined1  [8])&local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,message,this + (long)message);
        TrainerSpec::set_unk_piece(in_R9,(string *)local_1b8);
      }
      else {
        if (0x1a < (long)__n) {
LAB_0020d8ed:
          pdVar8 = result;
          if (__n == (char *)0x1b) goto switchD_0020c5c6_caseD_15;
LAB_0020d8f3:
          pdVar8 = result;
          if (__n != (char *)0x20) goto switchD_0020d758_default;
          goto switchD_0020c5c6_caseD_1a;
        }
        if (__n != (char *)0x9) goto LAB_0020d93a;
        iVar5 = bcmp(__s1,"bos_piece",9);
        if (iVar5 == 0) {
          local_1b8 = (undefined1  [8])&local_1a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b8,message,this + (long)message);
          TrainerSpec::set_bos_piece(in_R9,(string *)local_1b8);
        }
        else {
          iVar5 = bcmp(__s1,"eos_piece",9);
          if (iVar5 == 0) {
            local_1b8 = (undefined1  [8])&local_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,message,this + (long)message);
            TrainerSpec::set_eos_piece(in_R9,(string *)local_1b8);
          }
          else {
            iVar5 = bcmp(__s1,"pad_piece",9);
            if (iVar5 != 0) goto LAB_0020d96a;
            local_1b8 = (undefined1  [8])&local_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,message,this + (long)message);
            TrainerSpec::set_pad_piece(in_R9,(string *)local_1b8);
          }
        }
      }
LAB_0020de4a:
      if (local_1b8 != (undefined1  [8])&local_1a8) {
        operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
      }
      goto LAB_0020de9e;
    case (char *)0x4:
      iVar5 = bcmp(__s1,"model_type",(size_t)__n);
      if (iVar5 == 0) {
        local_1b8 = (undefined1  [8])&local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,message,this + (long)(&message->_has_bits_ + -5));
        auVar13 = local_1b8;
        if (local_1b0 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          lVar11 = 0;
          do {
            iVar5 = toupper((int)*(char *)((long)auVar13 + lVar11));
            *(char *)((long)auVar13 + lVar11) = (char)iVar5;
            lVar11 = lVar11 + 1;
          } while (local_1b0 !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)lVar11);
        }
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
                ::find(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                        ::kModelType_Map_abi_cxx11_._M_t,(key_type *)local_1b8);
        if (local_1b8 != (undefined1  [8])&local_1a8) {
          operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
        }
        if ((_Rb_tree_header *)cVar6._M_node ==
            &SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
             ::kModelType_Map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"unknown enumeration value of \"",0x1e);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as ",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"kModelType_Map",0xe);
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        _Var3 = cVar6._M_node[2]._M_color;
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x1000000;
        in_R9->model_type_ = _Var3;
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020c798::switchdataD_00258ccc +
                 (long)(int)(&switchD_0020c798::switchdataD_00258ccc)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x4:
          iVar5 = bcmp(__s1,"vocab_size",(size_t)__n);
          if (iVar5 == 0) {
            arg_25._M_str = (char *)&local_1c8;
            arg_25._M_len = (size_t)message;
            bVar4 = string_util::lexical_cast<int>(this,arg_25,(int *)result);
            if (!bVar4) {
              local_1b8._0_4_ = 3;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"cannot parse \"",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,(char *)message,(long)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"\" as int.",9);
              util::StatusBuilder::operator_cast_to_Status
                        ((StatusBuilder *)
                         this_00._M_t.
                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                         _M_head_impl);
              goto LAB_0020da34;
            }
            (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x2000000;
            in_R9->vocab_size_ = local_1c8;
            goto LAB_0020de9e;
          }
          if (pcVar1 < (char *)0x22) {
            result = (double *)
                     ((long)&switchD_0020c7cc::switchdataD_00258d54 +
                     (long)(int)(&switchD_0020c7cc::switchdataD_00258d54)[(long)pcVar1]);
            result_00 = result;
            pdVar8 = result;
            switch(pcVar1) {
            case (char *)0x0:
              goto switchD_0020c5c6_caseD_0;
            case (char *)0x3:
              goto switchD_0020c5c6_caseD_3;
            case (char *)0x5:
              goto switchD_0020c5c6_caseD_5;
            case (char *)0x6:
              goto switchD_0020c5c6_caseD_6;
            case (char *)0x7:
              goto switchD_0020c5c6_caseD_7;
            case (char *)0x8:
              goto switchD_0020c5c6_caseD_8;
            case (char *)0x9:
              goto switchD_0020c5c6_caseD_9;
            case (char *)0xa:
              goto switchD_0020c5c6_caseD_a;
            case (char *)0xc:
              goto switchD_0020c5c6_caseD_c;
            case (char *)0xd:
              goto switchD_0020c5c6_caseD_d;
            case (char *)0xe:
              goto switchD_0020c5c6_caseD_e;
            case (char *)0xf:
              goto switchD_0020c5c6_caseD_f;
            case (char *)0x10:
              goto switchD_0020c5c6_caseD_10;
            case (char *)0x11:
              goto switchD_0020c5c6_caseD_11;
            case (char *)0x12:
              goto switchD_0020c5c6_caseD_12;
            case (char *)0x13:
              goto switchD_0020c5c6_caseD_13;
            case (char *)0x14:
              goto switchD_0020c5c6_caseD_14;
            case (char *)0x15:
              goto switchD_0020c5c6_caseD_15;
            case (char *)0x16:
              goto switchD_0020c5c6_caseD_16;
            case (char *)0x17:
              goto switchD_0020c5c6_caseD_17;
            case (char *)0x1a:
              goto switchD_0020c5c6_caseD_1a;
            case (char *)0x21:
              goto switchD_0020c5c6_caseD_21;
            }
          }
          break;
        case (char *)0x5:
          goto switchD_0020c5c6_caseD_5;
        case (char *)0x6:
          goto switchD_0020c5c6_caseD_6;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020c5c6_caseD_9;
        case (char *)0xa:
          goto switchD_0020c5c6_caseD_a;
        case (char *)0xc:
          goto switchD_0020c5c6_caseD_c;
        case (char *)0xd:
          goto switchD_0020c5c6_caseD_d;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0xf:
          goto switchD_0020c5c6_caseD_f;
        case (char *)0x10:
          goto switchD_0020c5c6_caseD_10;
        case (char *)0x11:
          goto switchD_0020c5c6_caseD_11;
        case (char *)0x12:
          goto switchD_0020c5c6_caseD_12;
        case (char *)0x13:
          goto switchD_0020c5c6_caseD_13;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0x5:
switchD_0020c5c6_caseD_5:
      iVar5 = bcmp(__s1,"num_threads",(size_t)__n);
      if (iVar5 == 0) {
        arg_00._M_str = (char *)&local_1c8;
        arg_00._M_len = (size_t)message;
        bVar4 = string_util::lexical_cast<int>(this,arg_00,(int *)result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x20000000;
        in_R9->num_threads_ = local_1c8;
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020c96c::switchdataD_0025921c +
                 (long)(int)(&switchD_0020c96c::switchdataD_0025921c)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020d7e2_caseD_5;
        case (char *)0x6:
          goto switchD_0020c5c6_caseD_6;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020d078_caseD_9;
        case (char *)0xa:
          goto switchD_0020d26f_caseD_a;
        case (char *)0xc:
switchD_0020c904_caseD_c:
          iVar5 = bcmp(__s1,"num_sub_iterations",(size_t)__n);
          if (iVar5 == 0) {
            arg_20._M_str = (char *)&local_1c8;
            arg_20._M_len = (size_t)message;
            bVar4 = string_util::lexical_cast<int>(this,arg_20,(int *)result);
            if (!bVar4) {
              local_1b8._0_4_ = 3;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"cannot parse \"",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,(char *)message,(long)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"\" as int.",9);
              util::StatusBuilder::operator_cast_to_Status
                        ((StatusBuilder *)
                         this_00._M_t.
                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                         _M_head_impl);
              goto LAB_0020da34;
            }
            (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x40000000;
            in_R9->num_sub_iterations_ = local_1c8;
            goto LAB_0020de9e;
          }
          if (pcVar1 < (char *)0x22) {
            result = (double *)
                     ((long)&switchD_0020c9a0::switchdataD_002592a4 +
                     (long)(int)(&switchD_0020c9a0::switchdataD_002592a4)[(long)pcVar1]);
            result_00 = result;
            pdVar8 = result;
            switch(pcVar1) {
            case (char *)0x0:
              goto switchD_0020c5c6_caseD_0;
            case (char *)0x3:
              goto switchD_0020c5c6_caseD_3;
            case (char *)0x5:
              goto switchD_0020d7e2_caseD_5;
            case (char *)0x6:
              goto switchD_0020c5c6_caseD_6;
            case (char *)0x7:
              goto switchD_0020c5c6_caseD_7;
            case (char *)0x8:
              goto switchD_0020c5c6_caseD_8;
            case (char *)0x9:
              goto switchD_0020d078_caseD_9;
            case (char *)0xa:
              goto switchD_0020d26f_caseD_a;
            case (char *)0xd:
              goto switchD_0020d078_caseD_d;
            case (char *)0xe:
              goto switchD_0020c5c6_caseD_e;
            case (char *)0x11:
              goto switchD_0020d078_caseD_11;
            case (char *)0x12:
              goto switchD_0020c5c6_caseD_12;
            case (char *)0x13:
              goto switchD_0020c5c6_caseD_13;
            case (char *)0x14:
              goto switchD_0020c5c6_caseD_14;
            case (char *)0x15:
              goto switchD_0020c5c6_caseD_15;
            case (char *)0x16:
              goto switchD_0020c5c6_caseD_16;
            case (char *)0x17:
              goto switchD_0020c5c6_caseD_17;
            case (char *)0x1a:
              goto switchD_0020c5c6_caseD_1a;
            case (char *)0x21:
              goto switchD_0020c5c6_caseD_21;
            }
          }
          break;
        case (char *)0xd:
          goto switchD_0020d078_caseD_d;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x11:
          goto switchD_0020d078_caseD_11;
        case (char *)0x12:
          goto switchD_0020c5c6_caseD_12;
        case (char *)0x13:
          goto switchD_0020c5c6_caseD_13;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0x6:
switchD_0020c5c6_caseD_6:
      iVar5 = bcmp(__s1,"split_digits",(size_t)__n);
      if (iVar5 == 0) {
        psVar7 = (string_util *)0x4;
        if (this != (string_util *)0x0) {
          psVar7 = this;
        }
        pTVar12 = (TrainerSpec *)0x348924;
        if (this != (string_util *)0x0) {
          pTVar12 = message;
        }
        arg_10._M_str = (char *)&local_1c8;
        arg_10._M_len = (size_t)pTVar12;
        bVar4 = string_util::lexical_cast<bool>(psVar7,arg_10,(bool *)result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10)
          ;
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x20000;
        in_R9->split_digits_ = (bool)local_1c8._0_1_;
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020d1d3::switchdataD_0025954c +
                 (long)(int)(&switchD_0020d1d3::switchdataD_0025954c)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020d7e2_caseD_5;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020d26f_caseD_9;
        case (char *)0xa:
          goto switchD_0020d26f_caseD_a;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x12:
          goto switchD_0020d758_caseD_18;
        case (char *)0x13:
          goto switchD_0020c5c6_caseD_13;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0x7:
switchD_0020c5c6_caseD_7:
      iVar5 = bcmp(__s1,"byte_fallback",(size_t)__n);
      if (iVar5 == 0) {
        psVar7 = (string_util *)0x4;
        if (this != (string_util *)0x0) {
          psVar7 = this;
        }
        pTVar12 = (TrainerSpec *)0x348924;
        if (this != (string_util *)0x0) {
          pTVar12 = message;
        }
        arg_11._M_str = (char *)&local_1c8;
        arg_11._M_len = (size_t)pTVar12;
        bVar4 = string_util::lexical_cast<bool>(psVar7,arg_11,(bool *)result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10)
          ;
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x40000;
        in_R9->byte_fallback_ = (bool)local_1c8._0_1_;
        goto LAB_0020de9e;
      }
      if ((char *)0xa < pcVar1) {
        result_00 = (double *)&switchD_0020d4b9::switchdataD_002598c0;
        pdVar8 = (double *)&switchD_0020d4b9::switchdataD_002598c0;
        switch(__n) {
        case (char *)0x18:
          goto switchD_0020d758_caseD_18;
        case (char *)0x19:
        case (char *)0x1a:
        case (char *)0x1e:
        case (char *)0x1f:
          goto switchD_0020c5c6_caseD_1;
        case (char *)0x1b:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x1c:
          goto switchD_0020d758_caseD_1c;
        case (char *)0x1d:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x20:
          goto switchD_0020c5c6_caseD_1a;
        default:
          goto switchD_0020d758_default;
        }
      }
      result = (double *)
               ((long)&switchD_0020d508::switchdataD_00259894 +
               (long)(int)(&switchD_0020d508::switchdataD_00259894)[(long)pcVar1]);
      switch(pcVar1) {
      case (char *)0x0:
        goto switchD_0020c5c6_caseD_0;
      case (char *)0x3:
        goto switchD_0020c5c6_caseD_3;
      case (char *)0x5:
        goto switchD_0020d7e2_caseD_5;
      case (char *)0x7:
        goto switchD_0020d7e2_caseD_7;
      case (char *)0xa:
switchD_0020d26f_caseD_a:
        iVar5 = bcmp(__s1,"hard_vocab_limit",(size_t)__n);
        if (iVar5 == 0) {
          psVar7 = (string_util *)0x4;
          if (this != (string_util *)0x0) {
            psVar7 = this;
          }
          pTVar12 = (TrainerSpec *)0x348924;
          if (this != (string_util *)0x0) {
            pTVar12 = message;
          }
          arg_12._M_str = (char *)&local_1c8;
          arg_12._M_len = (size_t)pTVar12;
          bVar4 = string_util::lexical_cast<bool>(psVar7,arg_12,(bool *)result);
          if (!bVar4) {
            local_1b8._0_4_ = 3;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0,"cannot parse \"",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0,(char *)message,(long)this);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0,"\" as bool.",10);
            util::StatusBuilder::operator_cast_to_Status
                      ((StatusBuilder *)
                       this_00._M_t.
                       super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                       .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                       _M_head_impl);
            goto LAB_0020da34;
          }
          puVar2 = (in_R9->_has_bits_).has_bits_ + 1;
          *puVar2 = *puVar2 | 0x40;
          in_R9->hard_vocab_limit_ = (bool)local_1c8._0_1_;
          goto LAB_0020de9e;
        }
        result_00 = (double *)&switchD_0020d71a::switchdataD_00259904;
        pdVar8 = (double *)&switchD_0020d71a::switchdataD_00259904;
        switch(__n) {
        case (char *)0x18:
          goto switchD_0020d758_caseD_18;
        case (char *)0x19:
        case (char *)0x1a:
        case (char *)0x1e:
        case (char *)0x1f:
          break;
        case (char *)0x1b:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x1c:
          goto switchD_0020d758_caseD_1c;
        case (char *)0x1d:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x20:
          goto switchD_0020c5c6_caseD_1a;
        default:
          if ((char *)0x7 < pcVar1) goto switchD_0020d758_default;
          result = (double *)
                   ((long)&switchD_0020d54a::switchdataD_002598e4 +
                   (long)(int)(&switchD_0020d54a::switchdataD_002598e4)[(long)pcVar1]);
          switch(pcVar1) {
          case (char *)0x0:
            goto switchD_0020c5c6_caseD_0;
          case (char *)0x3:
            goto switchD_0020c5c6_caseD_3;
          case (char *)0x5:
            goto switchD_0020d7e2_caseD_5;
          case (char *)0x7:
            goto switchD_0020d7e2_caseD_7;
          }
        }
      }
      break;
    case (char *)0x8:
switchD_0020c5c6_caseD_8:
      iVar5 = bcmp(__s1,"required_chars",(size_t)__n);
      if (iVar5 == 0) {
        local_1b8 = (undefined1  [8])&local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,message,this + (long)message);
        TrainerSpec::set_required_chars(in_R9,(string *)local_1b8);
        goto LAB_0020de4a;
      }
      if ((char *)0xa < pcVar1) {
        result_00 = (double *)&switchD_0020d315::switchdataD_00259870;
        pdVar8 = (double *)&switchD_0020d315::switchdataD_00259870;
        switch(__n) {
        case (char *)0x18:
          goto switchD_0020d758_caseD_18;
        case (char *)0x19:
        case (char *)0x1a:
        case (char *)0x1e:
        case (char *)0x1f:
          goto switchD_0020c5c6_caseD_1;
        case (char *)0x1b:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x1c:
          goto switchD_0020d758_caseD_1c;
        case (char *)0x1d:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x20:
          goto switchD_0020c5c6_caseD_1a;
        default:
          goto switchD_0020d758_default;
        }
      }
      result = (double *)
               ((long)&switchD_0020d47f::switchdataD_00259844 +
               (long)(int)(&switchD_0020d47f::switchdataD_00259844)[(long)pcVar1]);
      switch(pcVar1) {
      case (char *)0x0:
        goto switchD_0020c5c6_caseD_0;
      case (char *)0x3:
        goto switchD_0020c5c6_caseD_3;
      case (char *)0x5:
        goto switchD_0020d7e2_caseD_5;
      case (char *)0x7:
        goto switchD_0020c5c6_caseD_7;
      case (char *)0xa:
        goto switchD_0020d26f_caseD_a;
      }
      break;
    case (char *)0x9:
switchD_0020c5c6_caseD_9:
      iVar5 = bcmp(__s1,"accept_language",(size_t)__n);
      if (iVar5 == 0) {
        text_00._M_str = (char *)result;
        text_00._M_len = (size_t)message;
        util::StrSplitAsCSV_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1b8,(util *)this,text_00);
        for (auVar13 = local_1b8; auVar13 != (undefined1  [8])local_1b0;
            auVar13 = (undefined1  [8])((long)auVar13 + 0x20)) {
          TrainerSpec::add_accept_language(in_R9,(string *)auVar13);
        }
        goto LAB_0020de94;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020c800::switchdataD_00258ddc +
                 (long)(int)(&switchD_0020c800::switchdataD_00258ddc)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020c5c6_caseD_5;
        case (char *)0x6:
          goto switchD_0020c5c6_caseD_6;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020d078_caseD_9;
        case (char *)0xa:
          goto switchD_0020c5c6_caseD_a;
        case (char *)0xc:
          goto switchD_0020c5c6_caseD_c;
        case (char *)0xd:
          goto switchD_0020c5c6_caseD_d;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0xf:
          goto switchD_0020c5c6_caseD_f;
        case (char *)0x10:
          goto switchD_0020c5c6_caseD_10;
        case (char *)0x11:
          goto switchD_0020c5c6_caseD_11;
        case (char *)0x12:
          goto switchD_0020c5c6_caseD_12;
        case (char *)0x13:
          goto switchD_0020c5c6_caseD_13;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0xa:
switchD_0020c5c6_caseD_a:
      iVar5 = bcmp(__s1,"shrinking_factor",(size_t)__n);
      if (iVar5 == 0) {
        arg_01._M_str = (char *)&local_1c8;
        arg_01._M_len = (size_t)message;
        bVar4 = string_util::lexical_cast<double>(this,arg_01,result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x10000000;
        in_R9->shrinking_factor_ = (float)(double)CONCAT44(uStack_1c4,local_1c8);
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020c938::switchdataD_0025910c +
                 (long)(int)(&switchD_0020c938::switchdataD_0025910c)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020c5c6_caseD_5;
        case (char *)0x6:
          goto switchD_0020c5c6_caseD_6;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020d078_caseD_9;
        case (char *)0xa:
          goto switchD_0020d26f_caseD_a;
        case (char *)0xc:
          goto switchD_0020c904_caseD_c;
        case (char *)0xd:
switchD_0020c904_caseD_d:
          iVar5 = bcmp(__s1,"max_sentence_length",(size_t)__n);
          if (iVar5 == 0) {
            arg_23._M_str = (char *)&local_1c8;
            arg_23._M_len = (size_t)message;
            bVar4 = string_util::lexical_cast<int>(this,arg_23,(int *)result);
            if (!bVar4) {
              local_1b8._0_4_ = 3;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"cannot parse \"",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,(char *)message,(long)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"\" as int.",9);
              util::StatusBuilder::operator_cast_to_Status
                        ((StatusBuilder *)
                         this_00._M_t.
                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                         _M_head_impl);
              goto LAB_0020da34;
            }
            (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x80000000;
            in_R9->max_sentence_length_ = local_1c8;
            goto LAB_0020de9e;
          }
          if (pcVar1 < (char *)0x22) {
            result = (double *)
                     ((long)&switchD_0020d048::switchdataD_00259194 +
                     (long)(int)(&switchD_0020d048::switchdataD_00259194)[(long)pcVar1]);
            result_00 = result;
            pdVar8 = result;
            switch(pcVar1) {
            case (char *)0x0:
              goto switchD_0020c5c6_caseD_0;
            case (char *)0x3:
              goto switchD_0020c5c6_caseD_3;
            case (char *)0x5:
              goto switchD_0020c5c6_caseD_5;
            case (char *)0x6:
              goto switchD_0020c5c6_caseD_6;
            case (char *)0x7:
              goto switchD_0020c5c6_caseD_7;
            case (char *)0x8:
              goto switchD_0020c5c6_caseD_8;
            case (char *)0x9:
              goto switchD_0020d078_caseD_9;
            case (char *)0xa:
              goto switchD_0020d26f_caseD_a;
            case (char *)0xc:
              goto switchD_0020c904_caseD_c;
            case (char *)0xd:
              goto switchD_0020d078_caseD_d;
            case (char *)0xe:
              goto switchD_0020c5c6_caseD_e;
            case (char *)0x11:
              goto switchD_0020d078_caseD_11;
            case (char *)0x12:
              goto switchD_0020c5c6_caseD_12;
            case (char *)0x13:
              goto switchD_0020c5c6_caseD_13;
            case (char *)0x14:
              goto switchD_0020c5c6_caseD_14;
            case (char *)0x15:
              goto switchD_0020c5c6_caseD_15;
            case (char *)0x16:
              goto switchD_0020c5c6_caseD_16;
            case (char *)0x17:
              goto switchD_0020c5c6_caseD_17;
            case (char *)0x1a:
              goto switchD_0020c5c6_caseD_1a;
            case (char *)0x21:
              goto switchD_0020c5c6_caseD_21;
            }
          }
          break;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x11:
          goto switchD_0020d078_caseD_11;
        case (char *)0x12:
          goto switchD_0020c5c6_caseD_12;
        case (char *)0x13:
          goto switchD_0020c5c6_caseD_13;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0xc:
switchD_0020c5c6_caseD_c:
      iVar5 = bcmp(__s1,"character_coverage",(size_t)__n);
      if (iVar5 == 0) {
        arg_05._M_str = (char *)&local_1c8;
        arg_05._M_len = (size_t)message;
        bVar4 = string_util::lexical_cast<double>(this,arg_05,result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x4000000;
        in_R9->character_coverage_ = (float)(double)CONCAT44(uStack_1c4,local_1c8);
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020c868::switchdataD_00258eec +
                 (long)(int)(&switchD_0020c868::switchdataD_00258eec)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020c5c6_caseD_5;
        case (char *)0x6:
          goto switchD_0020c5c6_caseD_6;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020d078_caseD_9;
        case (char *)0xa:
          goto switchD_0020c5c6_caseD_a;
        case (char *)0xc:
          goto switchD_0020c904_caseD_c;
        case (char *)0xd:
          goto switchD_0020c5c6_caseD_d;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x10:
          goto switchD_0020c5c6_caseD_10;
        case (char *)0x11:
          goto switchD_0020c5c6_caseD_11;
        case (char *)0x12:
          goto switchD_0020c5c6_caseD_12;
        case (char *)0x13:
          goto switchD_0020c5c6_caseD_13;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0xd:
switchD_0020c5c6_caseD_d:
      iVar5 = bcmp(__s1,"input_sentence_size",(size_t)__n);
      if (iVar5 == 0) {
        arg_04._M_str = (char *)&local_1c8;
        arg_04._M_len = (size_t)message;
        bVar4 = string_util::lexical_cast<unsigned_long>(this,arg_04,(unsigned_long *)result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x1000;
        in_R9->input_sentence_size_ = CONCAT44(uStack_1c4,local_1c8);
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020c89c::switchdataD_00258f74 +
                 (long)(int)(&switchD_0020c89c::switchdataD_00258f74)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020c5c6_caseD_5;
        case (char *)0x6:
          goto switchD_0020c5c6_caseD_6;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020d078_caseD_9;
        case (char *)0xa:
          goto switchD_0020c5c6_caseD_a;
        case (char *)0xc:
          goto switchD_0020c904_caseD_c;
        case (char *)0xd:
          goto switchD_0020c904_caseD_d;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x10:
          goto switchD_0020c5c6_caseD_10;
        case (char *)0x11:
          goto switchD_0020c5c6_caseD_11;
        case (char *)0x12:
          goto switchD_0020c5c6_caseD_12;
        case (char *)0x13:
          goto switchD_0020c5c6_caseD_13;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0xe:
switchD_0020c5c6_caseD_e:
      iVar5 = bcmp(__s1,"user_defined_symbols",(size_t)__n);
      if (iVar5 == 0) {
        text_01._M_str = (char *)result;
        text_01._M_len = (size_t)message;
        util::StrSplitAsCSV_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1b8,(util *)this,text_01);
        for (auVar13 = local_1b8; auVar13 != (undefined1  [8])local_1b0;
            auVar13 = (undefined1  [8])((long)auVar13 + 0x20)) {
          TrainerSpec::add_user_defined_symbols(in_R9,(string *)auVar13);
        }
LAB_0020de94:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b8);
        goto LAB_0020de9e;
      }
      if ((char *)0x1a < pcVar1) goto switchD_0020d758_default;
      result = (double *)
               ((long)&switchD_0020d2d7::switchdataD_002597d8 +
               (long)(int)(&switchD_0020d2d7::switchdataD_002597d8)[(long)pcVar1]);
      result_00 = result;
      pdVar8 = result;
      switch(pcVar1) {
      case (char *)0x0:
        goto switchD_0020c5c6_caseD_0;
      case (char *)0x3:
        goto switchD_0020c5c6_caseD_3;
      case (char *)0x5:
        goto switchD_0020d7e2_caseD_5;
      case (char *)0x7:
        goto switchD_0020c5c6_caseD_7;
      case (char *)0x8:
        goto switchD_0020c5c6_caseD_8;
      case (char *)0xa:
        goto switchD_0020d26f_caseD_a;
      case (char *)0x12:
        goto switchD_0020d758_caseD_18;
      case (char *)0x15:
        goto switchD_0020c5c6_caseD_15;
      case (char *)0x16:
        goto switchD_0020d758_caseD_1c;
      case (char *)0x17:
        goto switchD_0020c5c6_caseD_17;
      case (char *)0x1a:
        goto switchD_0020c5c6_caseD_1a;
      }
      break;
    case (char *)0xf:
switchD_0020c5c6_caseD_f:
      iVar5 = bcmp(__s1,"self_test_sample_size",(size_t)__n);
      if (iVar5 == 0) {
        arg_06._M_str = (char *)&local_1c8;
        arg_06._M_len = (size_t)message;
        bVar4 = string_util::lexical_cast<int>(this,arg_06,(int *)result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x400;
        in_R9->self_test_sample_size_ = local_1c8;
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020c834::switchdataD_00258e64 +
                 (long)(int)(&switchD_0020c834::switchdataD_00258e64)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020c5c6_caseD_5;
        case (char *)0x6:
          goto switchD_0020c5c6_caseD_6;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020d078_caseD_9;
        case (char *)0xa:
          goto switchD_0020c5c6_caseD_a;
        case (char *)0xc:
          goto switchD_0020c5c6_caseD_c;
        case (char *)0xd:
          goto switchD_0020c5c6_caseD_d;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x10:
          goto switchD_0020c5c6_caseD_10;
        case (char *)0x11:
          goto switchD_0020c5c6_caseD_11;
        case (char *)0x12:
          goto switchD_0020c5c6_caseD_12;
        case (char *)0x13:
          goto switchD_0020c5c6_caseD_13;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0x10:
switchD_0020c5c6_caseD_10:
      iVar5 = bcmp(__s1,"shuffle_input_sentence",(size_t)__n);
      if (iVar5 == 0) {
        psVar7 = (string_util *)0x4;
        if (this != (string_util *)0x0) {
          psVar7 = this;
        }
        pTVar12 = (TrainerSpec *)0x348924;
        if (this != (string_util *)0x0) {
          pTVar12 = message;
        }
        arg_03._M_str = (char *)&local_1c8;
        arg_03._M_len = (size_t)pTVar12;
        bVar4 = string_util::lexical_cast<bool>(psVar7,arg_03,(bool *)result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10)
          ;
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        puVar2 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar2 = *puVar2 | 2;
        in_R9->shuffle_input_sentence_ = (bool)local_1c8._0_1_;
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020c8d0::switchdataD_00258ffc +
                 (long)(int)(&switchD_0020c8d0::switchdataD_00258ffc)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020c5c6_caseD_5;
        case (char *)0x6:
          goto switchD_0020c5c6_caseD_6;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020d078_caseD_9;
        case (char *)0xa:
          goto switchD_0020c5c6_caseD_a;
        case (char *)0xc:
          goto switchD_0020c904_caseD_c;
        case (char *)0xd:
          goto switchD_0020c904_caseD_d;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x11:
          goto switchD_0020c5c6_caseD_11;
        case (char *)0x12:
          goto switchD_0020c5c6_caseD_12;
        case (char *)0x13:
          goto switchD_0020c5c6_caseD_13;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0x11:
switchD_0020c5c6_caseD_11:
      iVar5 = bcmp(__s1,"seed_sentencepiece_size",(size_t)__n);
      if (iVar5 == 0) {
        arg_02._M_str = (char *)&local_1c8;
        arg_02._M_len = (size_t)message;
        bVar4 = string_util::lexical_cast<int>(this,arg_02,(int *)result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x8000000;
        in_R9->seed_sentencepiece_size_ = local_1c8;
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020c904::switchdataD_00259084 +
                 (long)(int)(&switchD_0020c904::switchdataD_00259084)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020c5c6_caseD_5;
        case (char *)0x6:
          goto switchD_0020c5c6_caseD_6;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020d078_caseD_9;
        case (char *)0xa:
          goto switchD_0020c5c6_caseD_a;
        case (char *)0xc:
          goto switchD_0020c904_caseD_c;
        case (char *)0xd:
          goto switchD_0020c904_caseD_d;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x11:
          goto switchD_0020d078_caseD_11;
        case (char *)0x12:
          goto switchD_0020c5c6_caseD_12;
        case (char *)0x13:
          goto switchD_0020c5c6_caseD_13;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0x12:
switchD_0020c5c6_caseD_12:
      iVar5 = bcmp(__s1,"max_sentencepiece_length",(size_t)__n);
      if (iVar5 == 0) {
        arg_07._M_str = (char *)&local_1c8;
        arg_07._M_len = (size_t)message;
        bVar4 = string_util::lexical_cast<int>(this,arg_07,(int *)result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        puVar2 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar2 = *puVar2 | 1;
        in_R9->max_sentencepiece_length_ = local_1c8;
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020d078::switchdataD_0025932c +
                 (long)(int)(&switchD_0020d078::switchdataD_0025932c)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020d7e2_caseD_5;
        case (char *)0x6:
          goto switchD_0020c5c6_caseD_6;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
switchD_0020d078_caseD_9:
          iVar5 = bcmp(__s1,"split_by_number",(size_t)__n);
          if (iVar5 == 0) {
            psVar7 = (string_util *)0x4;
            if (this != (string_util *)0x0) {
              psVar7 = this;
            }
            pTVar12 = (TrainerSpec *)0x348924;
            if (this != (string_util *)0x0) {
              pTVar12 = message;
            }
            arg_19._M_str = (char *)&local_1c8;
            arg_19._M_len = (size_t)pTVar12;
            bVar4 = string_util::lexical_cast<bool>(psVar7,arg_19,(bool *)result);
            if (!bVar4) {
              local_1b8._0_4_ = 3;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"cannot parse \"",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,(char *)message,(long)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"\" as bool.",10);
              util::StatusBuilder::operator_cast_to_Status
                        ((StatusBuilder *)
                         this_00._M_t.
                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                         _M_head_impl);
              goto LAB_0020da34;
            }
            puVar2 = (in_R9->_has_bits_).has_bits_ + 1;
            *puVar2 = *puVar2 | 8;
            in_R9->split_by_number_ = (bool)local_1c8._0_1_;
            goto LAB_0020de9e;
          }
          if (pcVar1 < (char *)0x22) {
            result = (double *)
                     ((long)&switchD_0020d0ac::switchdataD_0025943c +
                     (long)(int)(&switchD_0020d0ac::switchdataD_0025943c)[(long)pcVar1]);
            result_00 = result;
            pdVar8 = result;
            switch(pcVar1) {
            case (char *)0x0:
              goto switchD_0020c5c6_caseD_0;
            case (char *)0x3:
              goto switchD_0020c5c6_caseD_3;
            case (char *)0x5:
              goto switchD_0020d7e2_caseD_5;
            case (char *)0x6:
              goto switchD_0020c5c6_caseD_6;
            case (char *)0x7:
              goto switchD_0020c5c6_caseD_7;
            case (char *)0x8:
              goto switchD_0020c5c6_caseD_8;
            case (char *)0x9:
              goto switchD_0020d26f_caseD_9;
            case (char *)0xa:
              goto switchD_0020d26f_caseD_a;
            case (char *)0xd:
              goto switchD_0020d078_caseD_d;
            case (char *)0xe:
              goto switchD_0020c5c6_caseD_e;
            case (char *)0x12:
              goto switchD_0020d758_caseD_18;
            case (char *)0x13:
              goto switchD_0020c5c6_caseD_13;
            case (char *)0x14:
              goto switchD_0020c5c6_caseD_14;
            case (char *)0x15:
              goto switchD_0020c5c6_caseD_15;
            case (char *)0x16:
              goto switchD_0020c5c6_caseD_16;
            case (char *)0x17:
              goto switchD_0020c5c6_caseD_17;
            case (char *)0x1a:
              goto switchD_0020c5c6_caseD_1a;
            case (char *)0x21:
              goto switchD_0020c5c6_caseD_21;
            }
          }
          break;
        case (char *)0xa:
          goto switchD_0020d26f_caseD_a;
        case (char *)0xd:
switchD_0020d078_caseD_d:
          iVar5 = bcmp(__s1,"split_by_whitespace",(size_t)__n);
          if (iVar5 == 0) {
            psVar7 = (string_util *)0x4;
            if (this != (string_util *)0x0) {
              psVar7 = this;
            }
            pTVar12 = (TrainerSpec *)0x348924;
            if (this != (string_util *)0x0) {
              pTVar12 = message;
            }
            arg_24._M_str = (char *)&local_1c8;
            arg_24._M_len = (size_t)pTVar12;
            bVar4 = string_util::lexical_cast<bool>(psVar7,arg_24,(bool *)result);
            if (!bVar4) {
              local_1b8._0_4_ = 3;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"cannot parse \"",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,(char *)message,(long)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"\" as bool.",10);
              util::StatusBuilder::operator_cast_to_Status
                        ((StatusBuilder *)
                         this_00._M_t.
                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                         _M_head_impl);
              goto LAB_0020da34;
            }
            puVar2 = (in_R9->_has_bits_).has_bits_ + 1;
            *puVar2 = *puVar2 | 0x10;
            in_R9->split_by_whitespace_ = (bool)local_1c8._0_1_;
            goto LAB_0020de9e;
          }
          if (pcVar1 < (char *)0x22) {
            result = (double *)
                     ((long)&switchD_0020d19f::switchdataD_002594c4 +
                     (long)(int)(&switchD_0020d19f::switchdataD_002594c4)[(long)pcVar1]);
            result_00 = result;
            pdVar8 = result;
            switch(pcVar1) {
            case (char *)0x0:
              goto switchD_0020c5c6_caseD_0;
            case (char *)0x3:
              goto switchD_0020c5c6_caseD_3;
            case (char *)0x5:
              goto switchD_0020d7e2_caseD_5;
            case (char *)0x6:
              goto switchD_0020c5c6_caseD_6;
            case (char *)0x7:
              goto switchD_0020c5c6_caseD_7;
            case (char *)0x8:
              goto switchD_0020c5c6_caseD_8;
            case (char *)0x9:
              goto switchD_0020d26f_caseD_9;
            case (char *)0xa:
              goto switchD_0020d26f_caseD_a;
            case (char *)0xe:
              goto switchD_0020c5c6_caseD_e;
            case (char *)0x12:
              goto switchD_0020d758_caseD_18;
            case (char *)0x13:
              goto switchD_0020c5c6_caseD_13;
            case (char *)0x14:
              goto switchD_0020c5c6_caseD_14;
            case (char *)0x15:
              goto switchD_0020c5c6_caseD_15;
            case (char *)0x16:
              goto switchD_0020c5c6_caseD_16;
            case (char *)0x17:
              goto switchD_0020c5c6_caseD_17;
            case (char *)0x1a:
              goto switchD_0020c5c6_caseD_1a;
            case (char *)0x21:
              goto switchD_0020c5c6_caseD_21;
            }
          }
          break;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x11:
switchD_0020d078_caseD_11:
          iVar5 = bcmp(__s1,"split_by_unicode_script",(size_t)__n);
          if (iVar5 == 0) {
            psVar7 = (string_util *)0x4;
            if (this != (string_util *)0x0) {
              psVar7 = this;
            }
            pTVar12 = (TrainerSpec *)0x348924;
            if (this != (string_util *)0x0) {
              pTVar12 = message;
            }
            arg_22._M_str = (char *)&local_1c8;
            arg_22._M_len = (size_t)pTVar12;
            bVar4 = string_util::lexical_cast<bool>(psVar7,arg_22,(bool *)result);
            if (!bVar4) {
              local_1b8._0_4_ = 3;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"cannot parse \"",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,(char *)message,(long)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"\" as bool.",10);
              util::StatusBuilder::operator_cast_to_Status
                        ((StatusBuilder *)
                         this_00._M_t.
                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                         _M_head_impl);
              goto LAB_0020da34;
            }
            puVar2 = (in_R9->_has_bits_).has_bits_ + 1;
            *puVar2 = *puVar2 | 4;
            in_R9->split_by_unicode_script_ = (bool)local_1c8._0_1_;
            goto LAB_0020de9e;
          }
          if (pcVar1 < (char *)0x22) {
            result = (double *)
                     ((long)&switchD_0020d16b::switchdataD_002593b4 +
                     (long)(int)(&switchD_0020d16b::switchdataD_002593b4)[(long)pcVar1]);
            result_00 = result;
            pdVar8 = result;
            switch(pcVar1) {
            case (char *)0x0:
              goto switchD_0020c5c6_caseD_0;
            case (char *)0x3:
              goto switchD_0020c5c6_caseD_3;
            case (char *)0x5:
              goto switchD_0020d7e2_caseD_5;
            case (char *)0x6:
              goto switchD_0020c5c6_caseD_6;
            case (char *)0x7:
              goto switchD_0020c5c6_caseD_7;
            case (char *)0x8:
              goto switchD_0020c5c6_caseD_8;
            case (char *)0x9:
              goto switchD_0020d078_caseD_9;
            case (char *)0xa:
              goto switchD_0020d26f_caseD_a;
            case (char *)0xd:
              goto switchD_0020d078_caseD_d;
            case (char *)0xe:
              goto switchD_0020c5c6_caseD_e;
            case (char *)0x12:
              goto switchD_0020d758_caseD_18;
            case (char *)0x13:
              goto switchD_0020c5c6_caseD_13;
            case (char *)0x14:
              goto switchD_0020c5c6_caseD_14;
            case (char *)0x15:
              goto switchD_0020c5c6_caseD_15;
            case (char *)0x16:
              goto switchD_0020c5c6_caseD_16;
            case (char *)0x17:
              goto switchD_0020c5c6_caseD_17;
            case (char *)0x1a:
              goto switchD_0020c5c6_caseD_1a;
            case (char *)0x21:
              goto switchD_0020c5c6_caseD_21;
            }
          }
          break;
        case (char *)0x12:
          goto switchD_0020d758_caseD_18;
        case (char *)0x13:
          goto switchD_0020c5c6_caseD_13;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0x13:
switchD_0020c5c6_caseD_13:
      iVar5 = bcmp(__s1,"pretokenization_delimiter",(size_t)__n);
      if (iVar5 == 0) {
        local_1b8 = (undefined1  [8])&local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,message,this + (long)message);
        TrainerSpec::set_pretokenization_delimiter(in_R9,(string *)local_1b8);
        goto LAB_0020de4a;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020d207::switchdataD_002595d4 +
                 (long)(int)(&switchD_0020d207::switchdataD_002595d4)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020d7e2_caseD_5;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020d26f_caseD_9;
        case (char *)0xa:
          goto switchD_0020d26f_caseD_a;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x12:
          goto switchD_0020d758_caseD_18;
        case (char *)0x14:
          goto switchD_0020c5c6_caseD_14;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0x14:
switchD_0020c5c6_caseD_14:
      iVar5 = bcmp(__s1,"treat_whitespace_as_suffix",(size_t)__n);
      if (iVar5 == 0) {
        psVar7 = (string_util *)0x4;
        if (this != (string_util *)0x0) {
          psVar7 = this;
        }
        pTVar12 = (TrainerSpec *)0x348924;
        if (this != (string_util *)0x0) {
          pTVar12 = message;
        }
        arg_09._M_str = (char *)&local_1c8;
        arg_09._M_len = (size_t)pTVar12;
        bVar4 = string_util::lexical_cast<bool>(psVar7,arg_09,(bool *)result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10)
          ;
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x8000;
        in_R9->treat_whitespace_as_suffix_ = (bool)local_1c8._0_1_;
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020d23b::switchdataD_0025965c +
                 (long)(int)(&switchD_0020d23b::switchdataD_0025965c)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020d7e2_caseD_5;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
          goto switchD_0020d26f_caseD_9;
        case (char *)0xa:
          goto switchD_0020d26f_caseD_a;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x12:
          goto switchD_0020d758_caseD_18;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020c5c6_caseD_16;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0x15:
switchD_0020c5c6_caseD_15:
      iVar5 = bcmp(__s1,"enable_differential_privacy",(size_t)__n);
      if (iVar5 == 0) {
        pTVar12 = (TrainerSpec *)0x348924;
        if (this != (string_util *)0x0) {
          pTVar12 = message;
        }
        psVar7 = (string_util *)0x4;
        if (this != (string_util *)0x0) {
          psVar7 = this;
        }
        arg_17._M_str = (char *)&local_1c8;
        arg_17._M_len = (size_t)pTVar12;
        bVar4 = string_util::lexical_cast<bool>(psVar7,arg_17,(bool *)pdVar8);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10)
          ;
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x4000;
        in_R9->enable_differential_privacy_ = (bool)local_1c8._0_1_;
        goto LAB_0020de9e;
      }
      result = pdVar8;
      if (__n == (char *)0x27) goto switchD_0020c5c6_caseD_21;
      if (__n == (char *)0x20) goto switchD_0020c5c6_caseD_1a;
      break;
    case (char *)0x16:
switchD_0020c5c6_caseD_16:
      iVar5 = bcmp(__s1,"allow_whitespace_only_pieces",(size_t)__n);
      if (iVar5 == 0) {
        psVar7 = (string_util *)0x4;
        if (this != (string_util *)0x0) {
          psVar7 = this;
        }
        pTVar12 = (TrainerSpec *)0x348924;
        if (this != (string_util *)0x0) {
          pTVar12 = message;
        }
        arg_08._M_str = (char *)&local_1c8;
        arg_08._M_len = (size_t)pTVar12;
        bVar4 = string_util::lexical_cast<bool>(psVar7,arg_08,(bool *)result);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10)
          ;
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x10000;
        in_R9->allow_whitespace_only_pieces_ = (bool)local_1c8._0_1_;
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x22) {
        result = (double *)
                 ((long)&switchD_0020d26f::switchdataD_002596e4 +
                 (long)(int)(&switchD_0020d26f::switchdataD_002596e4)[(long)pcVar1]);
        result_00 = result;
        pdVar8 = result;
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020d7e2_caseD_5;
        case (char *)0x7:
          goto switchD_0020c5c6_caseD_7;
        case (char *)0x8:
          goto switchD_0020c5c6_caseD_8;
        case (char *)0x9:
switchD_0020d26f_caseD_9:
          iVar5 = bcmp(__s1,"control_symbols",(size_t)__n);
          if (iVar5 == 0) {
            text_02._M_str = (char *)result;
            text_02._M_len = (size_t)message;
            util::StrSplitAsCSV_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1b8,(util *)this,text_02);
            for (auVar13 = local_1b8; auVar13 != (undefined1  [8])local_1b0;
                auVar13 = (undefined1  [8])((long)auVar13 + 0x20)) {
              TrainerSpec::add_control_symbols(in_R9,(string *)auVar13);
            }
            goto LAB_0020de94;
          }
          if ((char *)0x1a < pcVar1) goto switchD_0020d758_default;
          result = (double *)
                   ((long)&switchD_0020d2a3::switchdataD_0025976c +
                   (long)(int)(&switchD_0020d2a3::switchdataD_0025976c)[(long)pcVar1]);
          result_00 = result;
          pdVar8 = result;
          switch(pcVar1) {
          case (char *)0x0:
            goto switchD_0020c5c6_caseD_0;
          case (char *)0x3:
            goto switchD_0020c5c6_caseD_3;
          case (char *)0x5:
            goto switchD_0020d7e2_caseD_5;
          case (char *)0x7:
            goto switchD_0020c5c6_caseD_7;
          case (char *)0x8:
            goto switchD_0020c5c6_caseD_8;
          case (char *)0xa:
            goto switchD_0020d26f_caseD_a;
          case (char *)0xe:
            goto switchD_0020c5c6_caseD_e;
          case (char *)0x12:
            goto switchD_0020d758_caseD_18;
          case (char *)0x15:
            goto switchD_0020c5c6_caseD_15;
          case (char *)0x16:
            goto switchD_0020d758_caseD_1c;
          case (char *)0x17:
            goto switchD_0020c5c6_caseD_17;
          case (char *)0x1a:
            goto switchD_0020c5c6_caseD_1a;
          }
          break;
        case (char *)0xa:
          goto switchD_0020d26f_caseD_a;
        case (char *)0xe:
          goto switchD_0020c5c6_caseD_e;
        case (char *)0x12:
          goto switchD_0020d758_caseD_18;
        case (char *)0x15:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x16:
          goto switchD_0020d758_caseD_1c;
        case (char *)0x17:
          goto switchD_0020c5c6_caseD_17;
        case (char *)0x1a:
          goto switchD_0020c5c6_caseD_1a;
        case (char *)0x21:
          goto switchD_0020c5c6_caseD_21;
        }
      }
      break;
    case (char *)0x17:
switchD_0020c5c6_caseD_17:
      iVar5 = bcmp(__s1,"vocabulary_output_piece_score",(size_t)__n);
      if (iVar5 == 0) {
        psVar7 = (string_util *)0x4;
        if (this != (string_util *)0x0) {
          psVar7 = this;
        }
        pTVar12 = (TrainerSpec *)0x348924;
        if (this != (string_util *)0x0) {
          pTVar12 = message;
        }
        arg_13._M_str = (char *)&local_1c8;
        arg_13._M_len = (size_t)pTVar12;
        bVar4 = string_util::lexical_cast<bool>(psVar7,arg_13,(bool *)result_00);
        if (!bVar4) {
          local_1b8._0_4_ = 3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,"cannot parse \"",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0,(char *)message,(long)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as bool.",10)
          ;
          util::StatusBuilder::operator_cast_to_Status
                    ((StatusBuilder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          goto LAB_0020da34;
        }
        puVar2 = (in_R9->_has_bits_).has_bits_ + 1;
        *puVar2 = *puVar2 | 0x20;
        in_R9->vocabulary_output_piece_score_ = (bool)local_1c8._0_1_;
        goto LAB_0020de9e;
      }
      if (pcVar1 < (char *)0x8) {
        result = (double *)
                 ((long)&switchD_0020d7e2::switchdataD_00259928 +
                 (long)(int)(&switchD_0020d7e2::switchdataD_00259928)[(long)pcVar1]);
        switch(pcVar1) {
        case (char *)0x0:
          goto switchD_0020c5c6_caseD_0;
        case (char *)0x3:
          goto switchD_0020c5c6_caseD_3;
        case (char *)0x5:
          goto switchD_0020d7e2_caseD_5;
        case (char *)0x7:
switchD_0020d7e2_caseD_7:
          iVar5 = bcmp(__s1,"use_all_vocab",(size_t)__n);
          if (iVar5 == 0) {
            psVar7 = (string_util *)0x4;
            if (this != (string_util *)0x0) {
              psVar7 = this;
            }
            pTVar12 = (TrainerSpec *)0x348924;
            if (this != (string_util *)0x0) {
              pTVar12 = message;
            }
            arg_18._M_str = (char *)&local_1c8;
            arg_18._M_len = (size_t)pTVar12;
            bVar4 = string_util::lexical_cast<bool>(psVar7,arg_18,(bool *)result);
            if (!bVar4) {
              local_1b8._0_4_ = 3;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"cannot parse \"",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,(char *)message,(long)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"\" as bool.",10);
              util::StatusBuilder::operator_cast_to_Status
                        ((StatusBuilder *)
                         this_00._M_t.
                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                         _M_head_impl);
              goto LAB_0020da34;
            }
            (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x80000;
            in_R9->use_all_vocab_ = (bool)local_1c8._0_1_;
            goto LAB_0020de9e;
          }
          if ((long)__n < 0x1b) {
            if (__n == (char *)0x6) goto switchD_0020c5c6_caseD_0;
            goto LAB_0020c5f6;
          }
          goto LAB_0020d8ed;
        }
      }
      else {
        pdVar8 = (double *)&switchD_0020d758::switchdataD_00259948;
        result = result_00;
        switch(__n) {
        case (char *)0x18:
switchD_0020d758_caseD_18:
          result = pdVar8;
          iVar5 = bcmp(__s1,"seed_sentencepieces_file",(size_t)__n);
          if (iVar5 == 0) {
            local_1b8 = (undefined1  [8])&local_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,message,this + (long)message);
            TrainerSpec::set_seed_sentencepieces_file(in_R9,(string *)local_1b8);
            goto LAB_0020de4a;
          }
          if (0x1a < (long)__n) goto LAB_0020d8ed;
          if (pcVar1 < (char *)0x8) {
            result = (double *)
                     ((long)&switchD_0020d8cf::switchdataD_0025998c +
                     (long)(int)(&switchD_0020d8cf::switchdataD_0025998c)[(long)pcVar1]);
            switch(pcVar1) {
            case (char *)0x0:
              goto switchD_0020c5c6_caseD_0;
            case (char *)0x3:
              goto switchD_0020c5c6_caseD_3;
            case (char *)0x5:
              goto switchD_0020d7e2_caseD_5;
            case (char *)0x7:
              goto switchD_0020d7e2_caseD_7;
            }
          }
          break;
        case (char *)0x19:
        case (char *)0x1a:
        case (char *)0x1d:
        case (char *)0x1e:
        case (char *)0x1f:
          break;
        case (char *)0x1b:
          goto switchD_0020c5c6_caseD_15;
        case (char *)0x1c:
switchD_0020d758_caseD_1c:
          result = pdVar8;
          iVar5 = bcmp(__s1,"train_extremely_large_corpus",(size_t)__n);
          if (iVar5 == 0) {
            psVar7 = (string_util *)0x4;
            if (this != (string_util *)0x0) {
              psVar7 = this;
            }
            pTVar12 = (TrainerSpec *)0x348924;
            if (this != (string_util *)0x0) {
              pTVar12 = message;
            }
            arg_14._M_str = (char *)&local_1c8;
            arg_14._M_len = (size_t)pTVar12;
            bVar4 = string_util::lexical_cast<bool>(psVar7,arg_14,(bool *)result);
            if (!bVar4) {
              local_1b8._0_4_ = 3;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"cannot parse \"",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,(char *)message,(long)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0,"\" as bool.",10);
              util::StatusBuilder::operator_cast_to_Status
                        ((StatusBuilder *)
                         this_00._M_t.
                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                         _M_head_impl);
              goto LAB_0020da34;
            }
            (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x100000;
            in_R9->train_extremely_large_corpus_ = (bool)local_1c8._0_1_;
            goto LAB_0020de9e;
          }
          if (0x17 < (long)__n) {
            if ((long)__n < 0x20) {
              pdVar8 = result;
              if (__n == (char *)0x18) goto switchD_0020d758_caseD_18;
              goto LAB_0020d96a;
            }
            goto LAB_0020d8f3;
          }
          if (pcVar1 < (char *)0x8) {
            result = (double *)
                     ((long)&switchD_0020d796::switchdataD_0025996c +
                     (long)(int)(&switchD_0020d796::switchdataD_0025996c)[(long)pcVar1]);
            switch(pcVar1) {
            case (char *)0x0:
              goto switchD_0020c5c6_caseD_0;
            case (char *)0x3:
              goto switchD_0020c5c6_caseD_3;
            case (char *)0x5:
              goto switchD_0020d7e2_caseD_5;
            case (char *)0x7:
              goto switchD_0020d7e2_caseD_7;
            }
          }
          break;
        case (char *)0x20:
          goto switchD_0020c5c6_caseD_1a;
        default:
          goto switchD_0020d758_default;
        }
      }
      break;
    case (char *)0x1a:
switchD_0020c5c6_caseD_1a:
      iVar5 = bcmp(__s1,"differential_privacy_noise_level",(size_t)__n);
      result = pdVar8;
      if (iVar5 == 0) {
        arg_16._M_str = (char *)&local_1c8;
        arg_16._M_len = (size_t)message;
        bVar4 = string_util::lexical_cast<double>(this,arg_16,pdVar8);
        if (bVar4) {
          (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x400000;
          in_R9->differential_privacy_noise_level_ = (float)(double)CONCAT44(uStack_1c4,local_1c8);
          goto LAB_0020de9e;
        }
        local_1b8._0_4_ = 3;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"cannot parse \"",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,(char *)message,(long)this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
        util::StatusBuilder::operator_cast_to_Status
                  ((StatusBuilder *)
                   this_00._M_t.
                   super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                   .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
        goto LAB_0020da34;
      }
switchD_0020d758_default:
      if (__n == (char *)0x27) goto switchD_0020c5c6_caseD_21;
      break;
    case (char *)0x21:
switchD_0020c5c6_caseD_21:
      iVar5 = bcmp(__s1,"differential_privacy_clipping_threshold",(size_t)__n);
      if (iVar5 == 0) {
        arg_15._M_str = (char *)&local_1c8;
        arg_15._M_len = (size_t)message;
        bVar4 = string_util::lexical_cast<unsigned_long>(this,arg_15,(unsigned_long *)result);
        if (bVar4) {
          (in_R9->_has_bits_).has_bits_[0] = (in_R9->_has_bits_).has_bits_[0] | 0x800000;
          in_R9->differential_privacy_clipping_threshold_ = CONCAT44(uStack_1c4,local_1c8);
LAB_0020de9e:
          util::Status::Status
                    ((Status *)
                     this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)
          ;
          return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                  )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                    )this_00._M_t.
                     super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                     .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
        }
        local_1b8._0_4_ = 3;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"cannot parse \"",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,(char *)message,(long)this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\" as int.",9);
        util::StatusBuilder::operator_cast_to_Status
                  ((StatusBuilder *)
                   this_00._M_t.
                   super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                   .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
        goto LAB_0020da34;
      }
    }
  }
switchD_0020c5c6_caseD_1:
  local_1b8._0_4_ = 5;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0,"unknown field name \"",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,__s1,(long)__n);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0,"\" in TrainerSpec.",0x11);
  util::StatusBuilder::operator_cast_to_Status
            ((StatusBuilder *)
             this_00._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
LAB_0020da34:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  std::ios_base::~ios_base((ios_base *)local_140);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this_00._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceTrainer::SetProtoField(absl::string_view name,
                                                 absl::string_view value,
                                                 TrainerSpec *message) {
  CHECK_OR_RETURN(message);

  PARSE_REPEATED_STRING(input);
  PARSE_STRING(input_format);
  PARSE_STRING(model_prefix);

  static const std::map<std::string, TrainerSpec::ModelType> kModelType_Map = {
      {"UNIGRAM", TrainerSpec::UNIGRAM},
      {"BPE", TrainerSpec::BPE},
      {"WORD", TrainerSpec::WORD},
      {"CHAR", TrainerSpec::CHAR},
  };

  PARSE_ENUM(model_type, kModelType_Map);
  PARSE_INT32(vocab_size);
  PARSE_REPEATED_STRING(accept_language);
  PARSE_INT32(self_test_sample_size);
  PARSE_DOUBLE(character_coverage);
  PARSE_UINT64(input_sentence_size);
  PARSE_BOOL(shuffle_input_sentence);
  PARSE_INT32(seed_sentencepiece_size);
  PARSE_DOUBLE(shrinking_factor);
  PARSE_INT32(max_sentence_length);
  PARSE_INT32(num_threads);
  PARSE_INT32(num_sub_iterations);
  PARSE_INT32(max_sentencepiece_length);
  PARSE_BOOL(split_by_unicode_script);
  PARSE_BOOL(split_by_number);
  PARSE_BOOL(split_by_whitespace);
  PARSE_BOOL(split_digits);
  PARSE_STRING(pretokenization_delimiter);
  PARSE_BOOL(treat_whitespace_as_suffix);
  PARSE_BOOL(allow_whitespace_only_pieces);
  PARSE_REPEATED_STRING(control_symbols);
  PARSE_REPEATED_STRING(user_defined_symbols);
  PARSE_STRING(required_chars);
  PARSE_BOOL(byte_fallback);
  PARSE_BOOL(hard_vocab_limit);
  PARSE_BOOL(vocabulary_output_piece_score);
  PARSE_BOOL(train_extremely_large_corpus);
  PARSE_STRING(seed_sentencepieces_file);
  PARSE_BOOL(use_all_vocab);
  PARSE_INT32(unk_id);
  PARSE_INT32(bos_id);
  PARSE_INT32(eos_id);
  PARSE_INT32(pad_id);
  PARSE_STRING(unk_piece);
  PARSE_STRING(bos_piece);
  PARSE_STRING(eos_piece);
  PARSE_STRING(pad_piece);
  PARSE_STRING(unk_surface);
  PARSE_BOOL(enable_differential_privacy);
  PARSE_DOUBLE(differential_privacy_noise_level);
  PARSE_UINT64(differential_privacy_clipping_threshold);

  return util::StatusBuilder(util::StatusCode::kNotFound, GTL_LOC)
         << "unknown field name \"" << name << "\" in TrainerSpec.";
}